

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_listener_get_proto(void *arg,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  char *str;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  str = "";
  if (*(char **)((long)arg + 0x58) != (char *)0x0) {
    str = *(char **)((long)arg + 0x58);
  }
  iVar1 = nni_copyout_str(str,buf,szp,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return iVar1;
}

Assistant:

static int
ws_listener_get_proto(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_ws_listener *l = arg;
	int              rv;
	nni_mtx_lock(&l->mtx);
	rv = nni_copyout_str(l->proto != NULL ? l->proto : "", buf, szp, t);
	nni_mtx_unlock(&l->mtx);
	return (rv);
}